

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functional.hpp
# Opt level: O0

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
Functional::
zip<std::vector,int,std::allocator<int>,double,std::allocator<double>,std::pair<int,double>,std::allocator<std::pair<int,double>>>
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Functional *this,vector<int,_std::allocator<int>_> *aContainer,
          vector<double,_std::allocator<double>_> *anotherContainer)

{
  size_type __n;
  bool bVar1;
  reference __x;
  reference __y;
  reference this_00;
  pair<int,_double> pVar2;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_98;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  pair<int,_double> local_80;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_70;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_68;
  iterator oIt;
  allocator<std::pair<int,_double>_> local_4a;
  undefined1 local_49;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  const_iterator anotherIt;
  const_iterator aIt;
  size_type local_30;
  size_type *local_28;
  unsigned_long *dimension;
  vector<double,_std::allocator<double>_> *anotherContainer_local;
  vector<int,_std::allocator<int>_> *aContainer_local;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *output;
  
  dimension = (unsigned_long *)aContainer;
  anotherContainer_local = (vector<double,_std::allocator<double>_> *)this;
  aContainer_local = (vector<int,_std::allocator<int>_> *)__return_storage_ptr__;
  local_30 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)this)
  ;
  aIt._M_current =
       (int *)std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)dimension);
  local_28 = std::min<unsigned_long>(&local_30,(unsigned_long *)&aIt);
  anotherIt._M_current =
       (double *)
       std::vector<int,_std::allocator<int>_>::begin
                 ((vector<int,_std::allocator<int>_> *)anotherContainer_local);
  local_48._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)dimension);
  local_49 = 0;
  __n = *local_28;
  std::allocator<std::pair<int,_double>_>::allocator(&local_4a);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (__return_storage_ptr__,__n,&local_4a);
  std::allocator<std::pair<int,_double>_>::~allocator(&local_4a);
  local_68._M_current =
       (pair<int,_double> *)
       std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                 (__return_storage_ptr__);
  while( true ) {
    local_70._M_current =
         (pair<int,_double> *)
         std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                   (__return_storage_ptr__);
    bVar1 = __gnu_cxx::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    local_88 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *
                          )&anotherIt,0);
    __x = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator*(&local_88);
    local_90 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator++(&local_48,0);
    __y = __gnu_cxx::
          __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator*(&local_90);
    pVar2 = std::make_pair<int_const&,double_const&>(__x,__y);
    local_80.second = pVar2.second;
    local_80.first = pVar2.first;
    local_98 = __gnu_cxx::
               __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator++(&local_68,0);
    this_00 = __gnu_cxx::
              __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
              ::operator*(&local_98);
    std::pair<int,_double>::operator=(this_00,&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

static Container< OType, OAllocator > zip(const Container<FirstType, FirstAllocator> & aContainer,
            const Container<SecondType, SecondAllocator> & anotherContainer) {
        //body
        const unsigned long int & dimension = std::min(aContainer.size(), anotherContainer.size());
        typename Container<FirstType, FirstAllocator>::const_iterator aIt = aContainer.begin();
        typename Container<SecondType, SecondAllocator>::const_iterator anotherIt = anotherContainer.begin();

        Container<OType, OAllocator> output(dimension);
        typename Container< OType, OAllocator >::iterator oIt = output.begin();
        while (oIt != output.end()) {
            *oIt++ = std::make_pair(*aIt++, *anotherIt++);
        }

        return output;
    }